

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaLoader.cpp
# Opt level: O0

void __thiscall
Assimp::ColladaLoader::CollectNodes
          (ColladaLoader *this,aiNode *pNode,
          vector<const_aiNode_*,_std::allocator<const_aiNode_*>_> *poNodes)

{
  ulong local_28;
  size_t a;
  vector<const_aiNode_*,_std::allocator<const_aiNode_*>_> *poNodes_local;
  aiNode *pNode_local;
  ColladaLoader *this_local;
  
  poNodes_local = (vector<const_aiNode_*,_std::allocator<const_aiNode_*>_> *)pNode;
  pNode_local = (aiNode *)this;
  std::vector<const_aiNode_*,_std::allocator<const_aiNode_*>_>::push_back
            (poNodes,(value_type *)&poNodes_local);
  for (local_28 = 0;
      local_28 <
      *(uint *)&poNodes_local[0x2e].
                super__Vector_base<const_aiNode_*,_std::allocator<const_aiNode_*>_>._M_impl.
                super__Vector_impl_data._M_start; local_28 = local_28 + 1) {
    CollectNodes(this,poNodes_local[0x2e].
                      super__Vector_base<const_aiNode_*,_std::allocator<const_aiNode_*>_>._M_impl.
                      super__Vector_impl_data._M_finish[local_28],poNodes);
  }
  return;
}

Assistant:

void ColladaLoader::CollectNodes(const aiNode* pNode, std::vector<const aiNode*>& poNodes) const
{
    poNodes.push_back(pNode);
    for (size_t a = 0; a < pNode->mNumChildren; ++a) {
        CollectNodes(pNode->mChildren[a], poNodes);
    }
}